

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockfd.c
# Opt level: O3

void sfd_recv(void *arg,nni_aio *aio)

{
  nni_list *list;
  _Bool _Var1;
  nni_aio *pnVar2;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xb0));
  _Var1 = nni_aio_start(aio,sfd_cancel,arg);
  if (_Var1) {
    list = (nni_list *)((long)arg + 0x78);
    nni_aio_list_append(list,aio);
    pnVar2 = (nni_aio *)nni_list_first(list);
    if (pnVar2 == aio) {
      sfd_doread((nni_sfd_conn *)arg);
      pnVar2 = (nni_aio *)nni_list_first(list);
      if (pnVar2 == aio) {
        nni_posix_pfd_arm((nni_posix_pfd *)((long)arg + 0x38),1);
      }
    }
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xb0));
  return;
}

Assistant:

static void
sfd_recv(void *arg, nni_aio *aio)
{
	nni_sfd_conn *c = arg;

	nni_mtx_lock(&c->mtx);

	if (!nni_aio_start(aio, sfd_cancel, c)) {
		nni_mtx_unlock(&c->mtx);
		return;
	}
	nni_aio_list_append(&c->readq, aio);

	// If we are only job on the list, go ahead and try to do an
	// immediate transfer. This allows for faster completions in
	// many cases.  We also need not arm a list if it was already
	// armed.
	if (nni_list_first(&c->readq) == aio) {
		sfd_doread(c);
		// If we are still the first thing on the list, that
		// means we didn't finish the job, so arm the poller to
		// complete us.
		if (nni_list_first(&c->readq) == aio) {
			nni_posix_pfd_arm(&c->pfd, NNI_POLL_IN);
		}
	}
	nni_mtx_unlock(&c->mtx);
}